

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Maybe<kj::String_&> __thiscall
kj::HashMap<kj::ReadableDirectory_const*,kj::String>::find<kj::ReadableDirectory_const*>
          (HashMap<kj::ReadableDirectory_const*,kj::String> *this,ReadableDirectory **key)

{
  Maybe<kj::String_&> MVar1;
  anon_class_1_0_00000001 local_29;
  Maybe<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry_&> local_28;
  ReadableDirectory **local_20;
  ReadableDirectory **key_local;
  HashMap<const_kj::ReadableDirectory_*,_kj::String> *this_local;
  
  local_20 = key;
  key_local = (ReadableDirectory **)this;
  local_28 = Table<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>>
             ::find<0ul,kj::ReadableDirectory_const*&>
                       ((Table<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>>
                         *)this,key);
  MVar1 = Maybe<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry_&>::
          map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp____kj_map_h:358:30)>
                    (&local_28,&local_29);
  return (Maybe<kj::String_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}